

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ReadWriteGraph.h
# Opt level: O3

RWNode * __thiscall dg::dda::ReadWriteGraph::create(ReadWriteGraph *this,RWNodeType t)

{
  long lVar1;
  iterator iVar2;
  _Rb_tree_header *p_Var3;
  RWNodeCall *this_00;
  _Head_base<0UL,_dg::dda::RWNode_*,_false> local_20;
  
  if (t == CALL) {
    this_00 = (RWNodeCall *)operator_new(0x1a8);
    lVar1 = *(long *)this;
    *(long *)this = lVar1 + 1;
    RWNodeCall::RWNodeCall(this_00,(uint)(lVar1 + 1));
    iVar2._M_current =
         *(unique_ptr<dg::dda::RWNode,_std::default_delete<dg::dda::RWNode>_> **)(this + 0x10);
    if (iVar2._M_current ==
        *(unique_ptr<dg::dda::RWNode,_std::default_delete<dg::dda::RWNode>_> **)(this + 0x18)) {
      local_20._M_head_impl = (RWNode *)this_00;
      std::
      vector<std::unique_ptr<dg::dda::RWNode,std::default_delete<dg::dda::RWNode>>,std::allocator<std::unique_ptr<dg::dda::RWNode,std::default_delete<dg::dda::RWNode>>>>
      ::_M_realloc_insert<dg::dda::RWNodeCall*>
                ((vector<std::unique_ptr<dg::dda::RWNode,std::default_delete<dg::dda::RWNode>>,std::allocator<std::unique_ptr<dg::dda::RWNode,std::default_delete<dg::dda::RWNode>>>>
                  *)(this + 8),iVar2,(RWNodeCall **)&local_20);
      goto LAB_001123f6;
    }
    ((iVar2._M_current)->_M_t).
    super___uniq_ptr_impl<dg::dda::RWNode,_std::default_delete<dg::dda::RWNode>_>._M_t.
    super__Tuple_impl<0UL,_dg::dda::RWNode_*,_std::default_delete<dg::dda::RWNode>_>.
    super__Head_base<0UL,_dg::dda::RWNode_*,_false>._M_head_impl = (RWNode *)this_00;
  }
  else {
    local_20._M_head_impl = (RWNode *)operator_new(0x150);
    lVar1 = *(long *)this;
    *(long *)this = lVar1 + 1;
    ((local_20._M_head_impl)->super_SubgraphNode<dg::dda::RWNode>).id = (IDType)(lVar1 + 1);
    ((local_20._M_head_impl)->super_SubgraphNode<dg::dda::RWNode>).data = (void *)0x0;
    ((local_20._M_head_impl)->super_SubgraphNode<dg::dda::RWNode>).user_data = (void *)0x0;
    ((local_20._M_head_impl)->super_SubgraphNode<dg::dda::RWNode>).scc_id = 0;
    *(undefined8 *)
     &((local_20._M_head_impl)->super_SubgraphNode<dg::dda::RWNode>)._successors.
      super__Vector_base<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>._M_impl = 0;
    *(pointer *)
     ((long)&((local_20._M_head_impl)->super_SubgraphNode<dg::dda::RWNode>)._successors + 8) =
         (pointer)0x0;
    *(pointer *)
     ((long)&((local_20._M_head_impl)->super_SubgraphNode<dg::dda::RWNode>)._successors + 0x10) =
         (pointer)0x0;
    *(undefined8 *)
     &((local_20._M_head_impl)->super_SubgraphNode<dg::dda::RWNode>)._predecessors.
      super__Vector_base<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>._M_impl = 0;
    *(pointer *)
     ((long)&((local_20._M_head_impl)->super_SubgraphNode<dg::dda::RWNode>)._predecessors + 8) =
         (pointer)0x0;
    *(pointer *)
     ((long)&((local_20._M_head_impl)->super_SubgraphNode<dg::dda::RWNode>)._predecessors + 0x10) =
         (pointer)0x0;
    *(undefined8 *)
     &((local_20._M_head_impl)->super_SubgraphNode<dg::dda::RWNode>).operands.
      super__Vector_base<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>._M_impl = 0;
    *(pointer *)((long)&((local_20._M_head_impl)->super_SubgraphNode<dg::dda::RWNode>).operands + 8)
         = (pointer)0x0;
    *(pointer *)
     ((long)&((local_20._M_head_impl)->super_SubgraphNode<dg::dda::RWNode>).operands + 0x10) =
         (pointer)0x0;
    *(undefined8 *)
     &((local_20._M_head_impl)->super_SubgraphNode<dg::dda::RWNode>).users.
      super__Vector_base<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>._M_impl = 0;
    *(pointer *)((long)&((local_20._M_head_impl)->super_SubgraphNode<dg::dda::RWNode>).users + 8) =
         (pointer)0x0;
    *(pointer *)((long)&((local_20._M_head_impl)->super_SubgraphNode<dg::dda::RWNode>).users + 0x10)
         = (pointer)0x0;
    ((local_20._M_head_impl)->super_SubgraphNode<dg::dda::RWNode>).size = 0;
    (local_20._M_head_impl)->_vptr_RWNode = (_func_int **)&PTR__RWNode_0011ecb8;
    (local_20._M_head_impl)->type = t;
    (local_20._M_head_impl)->has_address_taken = false;
    (local_20._M_head_impl)->bblock = (RWBBlock *)0x0;
    p_Var3 = (_Rb_tree_header *)((long)&((local_20._M_head_impl)->annotations).defs + 8);
    (((_Rb_tree_header *)((long)&((local_20._M_head_impl)->annotations).defs + 8))->_M_header).
    _M_color = _S_red;
    *(_Base_ptr *)((long)&((local_20._M_head_impl)->annotations).defs + 0x10) = (_Base_ptr)0x0;
    *(_Rb_tree_header **)((long)&((local_20._M_head_impl)->annotations).defs + 0x18) = p_Var3;
    *(_Rb_tree_header **)((long)&((local_20._M_head_impl)->annotations).defs + 0x20) = p_Var3;
    *(size_t *)((long)&((local_20._M_head_impl)->annotations).defs + 0x28) = 0;
    p_Var3 = (_Rb_tree_header *)((long)&((local_20._M_head_impl)->annotations).overwrites + 8);
    (((_Rb_tree_header *)((long)&((local_20._M_head_impl)->annotations).overwrites + 8))->_M_header)
    ._M_color = _S_red;
    *(_Base_ptr *)((long)&((local_20._M_head_impl)->annotations).overwrites + 0x10) = (_Base_ptr)0x0
    ;
    *(_Rb_tree_header **)((long)&((local_20._M_head_impl)->annotations).overwrites + 0x18) = p_Var3;
    *(_Rb_tree_header **)((long)&((local_20._M_head_impl)->annotations).overwrites + 0x20) = p_Var3;
    *(size_t *)((long)&((local_20._M_head_impl)->annotations).overwrites + 0x28) = 0;
    p_Var3 = (_Rb_tree_header *)((long)&((local_20._M_head_impl)->annotations).uses + 8);
    (((_Rb_tree_header *)((long)&((local_20._M_head_impl)->annotations).uses + 8))->_M_header).
    _M_color = _S_red;
    *(_Base_ptr *)((long)&((local_20._M_head_impl)->annotations).uses + 0x10) = (_Base_ptr)0x0;
    *(_Rb_tree_header **)((long)&((local_20._M_head_impl)->annotations).uses + 0x18) = p_Var3;
    *(_Rb_tree_header **)((long)&((local_20._M_head_impl)->annotations).uses + 0x20) = p_Var3;
    ((local_20._M_head_impl)->defuse)._init = false;
    *(pointer *)((long)&((local_20._M_head_impl)->defuse).defuse + 8) = (pointer)0x0;
    *(pointer *)((long)&((local_20._M_head_impl)->defuse).defuse + 0x10) = (pointer)0x0;
    *(size_t *)((long)&((local_20._M_head_impl)->annotations).uses + 0x28) = 0;
    *(undefined8 *)
     &((local_20._M_head_impl)->defuse).defuse.
      super__Vector_base<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_> = 0;
    iVar2._M_current =
         *(unique_ptr<dg::dda::RWNode,_std::default_delete<dg::dda::RWNode>_> **)(this + 0x10);
    if (iVar2._M_current ==
        *(unique_ptr<dg::dda::RWNode,_std::default_delete<dg::dda::RWNode>_> **)(this + 0x18)) {
      std::
      vector<std::unique_ptr<dg::dda::RWNode,std::default_delete<dg::dda::RWNode>>,std::allocator<std::unique_ptr<dg::dda::RWNode,std::default_delete<dg::dda::RWNode>>>>
      ::_M_realloc_insert<dg::dda::RWNode*>
                ((vector<std::unique_ptr<dg::dda::RWNode,std::default_delete<dg::dda::RWNode>>,std::allocator<std::unique_ptr<dg::dda::RWNode,std::default_delete<dg::dda::RWNode>>>>
                  *)(this + 8),iVar2,&local_20._M_head_impl);
      goto LAB_001123f6;
    }
    ((iVar2._M_current)->_M_t).
    super___uniq_ptr_impl<dg::dda::RWNode,_std::default_delete<dg::dda::RWNode>_>._M_t.
    super__Tuple_impl<0UL,_dg::dda::RWNode_*,_std::default_delete<dg::dda::RWNode>_>.
    super__Head_base<0UL,_dg::dda::RWNode_*,_false>._M_head_impl = local_20._M_head_impl;
  }
  *(long *)(this + 0x10) = *(long *)(this + 0x10) + 8;
LAB_001123f6:
  return *(RWNode **)(*(long *)(this + 0x10) + -8);
}

Assistant:

RWNode &create(RWNodeType t) {
        if (t == RWNodeType::CALL) {
            _nodes.emplace_back(new RWNodeCall(++lastNodeID));
        } else {
            _nodes.emplace_back(new RWNode(++lastNodeID, t));
        }
        return *_nodes.back().get();
    }